

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeNVT::initialize(FluctuatingChargeNVT *this)

{
  bool bVar1;
  Snapshot *in_RDI;
  pointer pVVar2;
  pointer pSVar3;
  FluctuatingChargePropagator *in_stack_00000140;
  pair<double,_double> *eTherm;
  
  FluctuatingChargePropagator::initialize(in_stack_00000140);
  if (((ulong)(in_RDI->atomData).velocity.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    SimInfo::getSimParams
              ((SimInfo *)
               (in_RDI->atomData).velocity.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = Globals::haveDt((Globals *)0x30877d);
    if (bVar1) {
      SimInfo::getSimParams
                ((SimInfo *)
                 (in_RDI->atomData).velocity.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pVVar2 = (pointer)Globals::getDt((Globals *)0x308799);
      (in_RDI->atomData).angularMomentum.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = pVVar2;
      (in_RDI->atomData).angularMomentum.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish =
           (pointer)((double)(in_RDI->atomData).angularMomentum.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage * 0.5);
    }
    else {
      snprintf(painCave.errMsg,2000,"FluctuatingChargeNVT Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }
    SimInfo::getSimParams
              ((SimInfo *)
               (in_RDI->atomData).velocity.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = Globals::getUseIntialExtendedSystemState((Globals *)0x3087fd);
    if (!bVar1) {
      eTherm = (pair<double,_double> *)
               (in_RDI->atomData).torque.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::make_pair<double,double>((double *)in_RDI,(double *)eTherm);
      Snapshot::setElectronicThermostat(in_RDI,eTherm);
    }
    bVar1 = FluctuatingChargeParameters::haveTargetTemp((FluctuatingChargeParameters *)0x308857);
    if (bVar1) {
      pSVar3 = (pointer)FluctuatingChargeParameters::getTargetTemp
                                  ((FluctuatingChargeParameters *)0x3088ac);
      (in_RDI->atomData).aMat.
      super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "You can\'t use the FluctuatingChargeNVT propagator without a flucQ.targetTemp!\n");
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    bVar1 = FluctuatingChargeParameters::haveTauThermostat((FluctuatingChargeParameters *)0x3088c4);
    if (bVar1) {
      pSVar3 = (pointer)FluctuatingChargeParameters::getTauThermostat
                                  ((FluctuatingChargeParameters *)0x308919);
      (in_RDI->atomData).aMat.
      super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "If you use the FluctuatingChargeNVT\n\tpropagator, you must set flucQ.tauThermostat .\n"
              );
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    (**(code **)&(in_RDI->atomData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].super_Vector<double,_3U>)();
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeNVT Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!info_->getSimParams()->getUseIntialExtendedSystemState()) {
        snap->setElectronicThermostat(make_pair(0.0, 0.0));
      }

      if (!fqParams_->haveTargetTemp()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "You can't use the FluctuatingChargeNVT "
                 "propagator without a flucQ.targetTemp!\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        targetTemp_ = fqParams_->getTargetTemp();
      }

      // We must set tauThermostat.

      if (!fqParams_->haveTauThermostat()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "If you use the FluctuatingChargeNVT\n"
                 "\tpropagator, you must set flucQ.tauThermostat .\n");

        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      } else {
        tauThermostat_ = fqParams_->getTauThermostat();
      }
      updateSizes();
    }
  }